

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

void __thiscall pbrt::Transform::Transform(Transform *this,Frame *frame)

{
  SquareMatrix<4> local_40;
  
  local_40.m[0][2] = (frame->x).super_Tuple3<pbrt::Vector3,_float>.z;
  local_40.m[0][0] = (frame->x).super_Tuple3<pbrt::Vector3,_float>.x;
  local_40.m[0][1] = (frame->x).super_Tuple3<pbrt::Vector3,_float>.y;
  local_40.m[1][2] = (frame->y).super_Tuple3<pbrt::Vector3,_float>.z;
  local_40.m[2][2] = (frame->z).super_Tuple3<pbrt::Vector3,_float>.z;
  local_40.m[0][3] = 0.0;
  local_40.m[1][0] = (frame->y).super_Tuple3<pbrt::Vector3,_float>.x;
  local_40.m[1][1] = (frame->y).super_Tuple3<pbrt::Vector3,_float>.y;
  local_40.m[1][3] = 0.0;
  local_40.m[2][0] = (frame->z).super_Tuple3<pbrt::Vector3,_float>.x;
  local_40.m[2][1] = (frame->z).super_Tuple3<pbrt::Vector3,_float>.y;
  local_40.m._44_16_ = ZEXT816(0) << 0x20;
  local_40.m[3][3] = 1.0;
  Transform(this,&local_40);
  return;
}

Assistant:

inline Transform::Transform(const Frame &frame)
    : Transform(SquareMatrix<4>(frame.x.x, frame.x.y, frame.x.z, 0, frame.y.x, frame.y.y,
                                frame.y.z, 0, frame.z.x, frame.z.y, frame.z.z, 0, 0, 0, 0,
                                1)) {}